

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XIncludeUtils::isInCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *toFind)

{
  XIncludeHistoryNode *pXVar1;
  bool bVar2;
  
  do {
    pXVar1 = this->fIncludeHistoryHead;
    if (pXVar1 == (XIncludeHistoryNode *)0x0) break;
    bVar2 = XMLString::equals(toFind,pXVar1->URI);
    this = (XIncludeUtils *)&pXVar1->next;
  } while (!bVar2);
  return pXVar1 != (XIncludeHistoryNode *)0x0;
}

Assistant:

bool
XIncludeUtils::isInCurrentInclusionHistoryStack(const XMLCh *toFind){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    /* walk the list */
    while (historyCursor != NULL){
        if (XMLString::equals(toFind, historyCursor->URI)){
            return true;
        }
        historyCursor = historyCursor->next;
    }
    return false;
}